

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void findgotos(LexState *ls,Labeldesc *lb)

{
  Dyndata *pDVar1;
  int local_24;
  int i;
  Labellist *gl;
  Labeldesc *lb_local;
  LexState *ls_local;
  
  pDVar1 = ls->dyd;
  local_24 = ls->fs->bl->firstgoto;
  while (local_24 < (pDVar1->gt).n) {
    if ((pDVar1->gt).arr[local_24].name == lb->name) {
      closegoto(ls,local_24,lb);
    }
    else {
      local_24 = local_24 + 1;
    }
  }
  return;
}

Assistant:

static void findgotos(LexState *ls, Labeldesc *lb) {
    Labellist *gl = &ls->dyd->gt;
    int i = ls->fs->bl->firstgoto;
    while (i < gl->n) {
        if (eqstr(gl->arr[i].name, lb->name))
            closegoto(ls, i, lb);
        else
            i++;
    }
}